

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cap.cc
# Opt level: O0

S2Cap * __thiscall S2Cap::Union(S2Cap *__return_storage_ptr__,S2Cap *this,S2Cap *other)

{
  bool bVar1;
  S2Point *pSVar2;
  S2Point *pSVar3;
  S1Angle SVar4;
  S1Angle SVar5;
  undefined1 local_b0 [8];
  S2Point result_center;
  S1Angle result_radius;
  S1Angle local_48;
  S1Angle distance;
  S1Angle other_radius;
  S1Angle this_radius;
  S2Cap *other_local;
  S2Cap *this_local;
  
  bVar1 = ::operator<((S1ChordAngle)(this->radius_).length2_,(S1ChordAngle)(other->radius_).length2_
                     );
  if (bVar1) {
    Union(__return_storage_ptr__,other,this);
  }
  else {
    bVar1 = is_full(this);
    if ((!bVar1) && (bVar1 = is_empty(other), !bVar1)) {
      SVar4 = GetRadius(this);
      distance = GetRadius(other);
      pSVar2 = center(this);
      pSVar3 = center(other);
      S1Angle::S1Angle(&local_48,pSVar2,pSVar3);
      SVar5 = ::operator+(local_48,distance);
      bVar1 = operator>=(SVar4,SVar5);
      if (!bVar1) {
        SVar5 = ::operator+(local_48,SVar4);
        result_center.c_[2] = distance.radians_;
        SVar5 = ::operator+(SVar5,distance);
        SVar5 = ::operator*(0.5,SVar5);
        SVar4 = ::operator-(local_48,SVar4);
        SVar4 = ::operator+(SVar4,distance);
        SVar4 = ::operator*(0.5,SVar4);
        pSVar2 = center(this);
        pSVar3 = center(other);
        S2::InterpolateAtDistance((S2Point *)local_b0,SVar4,pSVar2,pSVar3);
        S2Cap(__return_storage_ptr__,(S2Point *)local_b0,SVar5);
        return __return_storage_ptr__;
      }
      S2Cap(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
    S2Cap(__return_storage_ptr__,this);
  }
  return __return_storage_ptr__;
}

Assistant:

S2Cap S2Cap::Union(const S2Cap& other) const {
  if (radius_ < other.radius_) {
    return other.Union(*this);
  }
  if (is_full() || other.is_empty()) {
    return *this;
  }
  // This calculation would be more efficient using S1ChordAngles.
  S1Angle this_radius = GetRadius();
  S1Angle other_radius = other.GetRadius();
  S1Angle distance(center(), other.center());
  if (this_radius >= distance + other_radius) {
    return *this;
  } else {
    S1Angle result_radius = 0.5 * (distance + this_radius + other_radius);
    S2Point result_center = S2::InterpolateAtDistance(
        0.5 * (distance - this_radius + other_radius),
        center(),
        other.center());
    return S2Cap(result_center, result_radius);
  }
}